

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_motion.c
# Opt level: O3

void fsnav_ins_motion_euler(void)

{
  double dVar1;
  undefined1 auVar2 [16];
  long lVar3;
  undefined1 *puVar4;
  fsnav_struct *pfVar5;
  long lVar6;
  double *b;
  fsnav_imu *pfVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  double dVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  char alt_token [4];
  char lat_token [4];
  char lon_token [4];
  double alt_range [2];
  double lat_range [2];
  double lon_range [2];
  double C_2 [9];
  double dvcor [3];
  char local_124 [12];
  undefined1 local_118 [16];
  double local_108;
  undefined8 uStack_100;
  double local_f8 [4];
  double local_d8;
  undefined8 uStack_d0;
  double local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  double local_a8 [7];
  undefined1 local_70 [72];
  double local_28 [3];
  
  builtin_strncpy(local_124 + 8,"lon",4);
  builtin_strncpy(local_124 + 4,"lat",4);
  builtin_strncpy(local_124,"alt",4);
  local_a8[4] = -180.0;
  local_a8[5] = 180.0;
  local_a8[2] = -90.0;
  local_a8[3] = 90.0;
  local_a8[0] = -20000.0;
  local_a8[1] = 50000.0;
  pfVar7 = fsnav->imu;
  local_108 = fsnav_ins_motion_euler::t0;
  if (pfVar7 != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      (pfVar7->sol).v_valid = '\0';
      (pfVar7->sol).llh_valid = '\0';
      dVar11 = fsnav_ins_motion_parse_double
                         (local_124 + 8,pfVar7->cfg,pfVar7->cfglength,local_a8 + 4,0.0);
      pfVar7 = fsnav->imu;
      (pfVar7->sol).llh[0] = dVar11 / (fsnav->imu_const).rad2deg;
      dVar11 = fsnav_ins_motion_parse_double
                         (local_124 + 4,pfVar7->cfg,pfVar7->cfglength,local_a8 + 2,0.0);
      pfVar7 = fsnav->imu;
      (pfVar7->sol).llh[1] = dVar11 / (fsnav->imu_const).rad2deg;
      dVar11 = fsnav_ins_motion_parse_double(local_124,pfVar7->cfg,pfVar7->cfglength,local_a8,0.0);
      pfVar7 = fsnav->imu;
      (pfVar7->sol).llh[2] = dVar11;
      (pfVar7->sol).llh_valid = '\x01';
      (pfVar7->sol).v[0] = 0.0;
      (pfVar7->sol).v[1] = 0.0;
      (pfVar7->sol).v[2] = 0.0;
      (pfVar7->sol).v_valid = '\x01';
      fsnav_ins_motion_euler::t0 = -1.0;
      local_108 = fsnav_ins_motion_euler::t0;
    }
    else if ((((-1 < fsnav->mode) && ((pfVar7->sol).v_valid != '\0')) &&
             ((pfVar7->sol).llh_valid != '\0')) &&
            ((((pfVar7->sol).L_valid != '\0' && (pfVar7->f_valid != '\0')) &&
             ((pfVar7->g_valid != '\0' && (local_108 = pfVar7->t, 0.0 <= fsnav_ins_motion_euler::t0)
              ))))) {
      local_118._8_8_ = local_118._0_8_;
      local_118._0_8_ = fsnav_ins_motion_euler::t0;
      uStack_100 = 0;
      fsnav_ins_motion_euler::t0 = local_108;
      dVar11 = sin((pfVar7->sol).llh[1]);
      local_b8._8_4_ = extraout_XMM0_Dc;
      local_b8._0_8_ = dVar11;
      local_b8._12_4_ = extraout_XMM0_Dd;
      dVar1 = cos((fsnav->imu->sol).llh[1]);
      pfVar5 = fsnav;
      dVar11 = (fsnav->imu_const).e2;
      dVar10 = (double)local_b8._0_8_ * dVar11 * (double)local_b8._0_8_;
      dVar15 = dVar10 * dVar10;
      local_d8 = (dVar15 * 3.0 * 0.125 + dVar10 * 0.5 + 1.0) * (fsnav->imu_const).a;
      pfVar7 = fsnav->imu;
      dVar12 = (pfVar7->sol).llh[2];
      local_c8 = (dVar15 * dVar10 + dVar10 + 1.0 + dVar15) * (1.0 - dVar11) * local_d8 + dVar12;
      local_d8 = local_d8 + dVar12;
      (pfVar7->sol).llh_valid = '\0';
      (pfVar7->sol).v_valid = '\0';
      auVar13._0_8_ = -(pfVar7->sol).v[1];
      auVar13._8_8_ = (pfVar7->sol).v[0];
      uStack_c0 = local_b8._8_8_;
      uStack_d0 = 0;
      auVar14._8_8_ = local_d8;
      auVar14._0_8_ = local_c8;
      auVar14 = divpd(auVar13,auVar14);
      *(undefined1 (*) [16])pfVar7->W = auVar14;
      if (0.00390625 <= dVar1) {
        local_f8[2] = (auVar14._8_8_ * (double)local_b8._0_8_) / dVar1;
      }
      else {
        local_f8[2] = 0.0;
      }
      pfVar7->W[2] = local_f8[2];
      pfVar7->W_valid = 0.00390625 <= dVar1;
      local_108 = local_108 - (double)local_118._0_8_;
      local_f8[0] = auVar14._0_8_;
      dVar11 = (pfVar5->imu_const).u;
      dVar11 = dVar11 + dVar11;
      local_118._8_4_ = extraout_XMM0_Dc_00;
      local_118._0_8_ = dVar1;
      local_118._12_4_ = extraout_XMM0_Dd_00;
      local_f8[1] = auVar14._8_8_ + dVar1 * dVar11;
      local_f8[2] = local_f8[2] + (double)local_b8._0_8_ * dVar11;
      fsnav_linal_cross3x1(local_28,(pfVar7->sol).v,local_f8);
      pfVar7 = fsnav->imu;
      if (pfVar7->w_valid == '\0') {
        b = pfVar7->f;
      }
      else {
        lVar3 = 0;
        do {
          local_f8[lVar3] = pfVar7->w[lVar3] * local_108 * 0.5;
          lVar3 = lVar3 + 1;
        } while (lVar3 != 3);
        fsnav_linal_eul2mat(local_a8 + 6,local_f8);
        pfVar7 = fsnav->imu;
        puVar4 = local_70;
        lVar3 = 0;
        do {
          dVar11 = *(double *)(local_70 + lVar3 * 0x18 + -8) * pfVar7->f[0];
          *(double *)(local_70 + lVar3 * 8 + -8) = dVar11;
          lVar6 = 0;
          do {
            dVar11 = dVar11 + *(double *)(puVar4 + lVar6 * 8) * pfVar7->f[lVar6 + 1];
            *(double *)(local_70 + lVar3 * 8 + -8) = dVar11;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 2);
          lVar3 = lVar3 + 1;
          puVar4 = puVar4 + 0x18;
        } while (lVar3 != 3);
        b = local_a8 + 6;
      }
      fsnav_linal_mmul1T(local_f8,(pfVar7->sol).L,b,3,3,1);
      pfVar5 = fsnav;
      pfVar7 = fsnav->imu;
      lVar3 = 0;
      do {
        (pfVar7->sol).v[lVar3] =
             (local_28[lVar3] + local_f8[lVar3] + pfVar7->g[lVar3]) * local_108 +
             (pfVar7->sol).v[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 3);
      (pfVar7->sol).v_valid = '\x01';
      if ((double)local_118._0_8_ < 0.00390625) {
        (pfVar7->sol).llh[2] = local_108 * (pfVar7->sol).v[2] + (pfVar7->sol).llh[2];
        (pfVar7->sol).llh_valid = '\0';
        local_108 = fsnav_ins_motion_euler::t0;
      }
      else {
        auVar2._8_8_ = local_c8;
        auVar2._0_8_ = (double)local_118._0_8_ * local_d8;
        auVar14 = divpd(*(undefined1 (*) [16])(pfVar7->sol).v,auVar2);
        dVar12 = local_108 * auVar14._8_8_ + (pfVar7->sol).llh[1];
        (pfVar7->sol).llh[0] = local_108 * auVar14._0_8_ + (pfVar7->sol).llh[0];
        (pfVar7->sol).llh[1] = dVar12;
        (pfVar7->sol).llh[2] = local_108 * (pfVar7->sol).v[2] + (pfVar7->sol).llh[2];
        dVar11 = (pfVar5->imu_const).pi;
        uVar8 = SUB84(dVar11,0);
        uVar9 = (undefined4)((ulong)dVar11 >> 0x20);
        if (dVar12 < dVar11 * -0.5) {
          (pfVar7->sol).llh[1] = -dVar11 - dVar12;
          fsnav_ins_motion_flip_sol_over_pole(&pfVar7->sol);
          pfVar7 = fsnav->imu;
          dVar12 = (pfVar7->sol).llh[1];
          dVar11 = (fsnav->imu_const).pi;
          uVar8 = SUB84(dVar11,0);
          uVar9 = (undefined4)((ulong)dVar11 >> 0x20);
          pfVar5 = fsnav;
        }
        if ((double)CONCAT44(uVar9,uVar8) * 0.5 < dVar12) {
          (pfVar7->sol).llh[1] = (double)CONCAT44(uVar9,uVar8) - dVar12;
          fsnav_ins_motion_flip_sol_over_pole(&pfVar7->sol);
          pfVar7 = fsnav->imu;
          dVar11 = (fsnav->imu_const).pi;
          uVar8 = SUB84(dVar11,0);
          uVar9 = (undefined4)((ulong)dVar11 >> 0x20);
          pfVar5 = fsnav;
        }
        dVar11 = (pfVar7->sol).llh[0];
        if (dVar11 < -(double)CONCAT44(uVar9,uVar8)) {
          do {
            dVar11 = dVar11 + (double)CONCAT44(uVar9,uVar8) + (double)CONCAT44(uVar9,uVar8);
            (pfVar7->sol).llh[0] = dVar11;
            dVar12 = (pfVar5->imu_const).pi;
            uVar8 = SUB84(dVar12,0);
            uVar9 = (undefined4)((ulong)dVar12 >> 0x20);
          } while (dVar11 < -dVar12);
        }
        while ((double)CONCAT44(uVar9,uVar8) <= dVar11 && dVar11 != (double)CONCAT44(uVar9,uVar8)) {
          dVar11 = dVar11 - ((double)CONCAT44(uVar9,uVar8) + (double)CONCAT44(uVar9,uVar8));
          (pfVar7->sol).llh[0] = dVar11;
          dVar12 = (pfVar5->imu_const).pi;
          uVar8 = SUB84(dVar12,0);
          uVar9 = (undefined4)((ulong)dVar12 >> 0x20);
        }
        (pfVar7->sol).llh_valid = '\x01';
        local_108 = fsnav_ins_motion_euler::t0;
      }
    }
  }
  fsnav_ins_motion_euler::t0 = local_108;
  return;
}

Assistant:

void fsnav_ins_motion_euler(void) {

	const char 
		lon_token[] = "lon",        // starting longitude parameter name in configuration
		lat_token[] = "lat",        // starting latitude  parameter name in configuration
		alt_token[] = "alt";        // starting altitude  parameter name in configuration

	const double 
		lon_range[] = {-180, +180},	// longitude range, 0 by default
		lat_range[] = { -90,  +90},	// latitude  range, 0 by default
		alt_range[] = {-20e3,50e3},	// altitude  range, 0 by default
		eps = 1.0/0x0100;			// 2^-8, guaranteed non-zero value in IEEE754 half-precision format

	static double t0  = -1;         // previous time

	double dt;                      // time step
	double
		sphi, cphi,	                // sine and cosine of latitude
		Rn_h, Re_h,	                // south-to-north and east-to-west curvature radii, altitude-adjusted
		e2s2, e4s4,	                // e^2*sin(phi)^2, (e^2*sin(phi)^2)^2
		dvrel[3],	                // proper acceleration in navigation frame
		dvcor[3],	                // Coriolis acceleration in navigation frame
		C_2[9];                     // intermediate matrix/vector for modified Euler component
	size_t i, j;                    // common index variables


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init

		// drop validity flags
		fsnav->imu->sol.  v_valid = 0;
		fsnav->imu->sol.llh_valid = 0;		
		// parse parameters from configuration	
		fsnav->imu->sol.llh[0] = // starting longitude
			fsnav_ins_motion_parse_double(lon_token, fsnav->imu->cfg,fsnav->imu->cfglength, (double *)lon_range,0)
			/fsnav->imu_const.rad2deg; // degrees to radians
		fsnav->imu->sol.llh[1] = // starting latitude
			fsnav_ins_motion_parse_double(lat_token, fsnav->imu->cfg,fsnav->imu->cfglength, (double *)lat_range,0)
			/fsnav->imu_const.rad2deg; // degrees to radians
		fsnav->imu->sol.llh[2] = // starting altitude
			fsnav_ins_motion_parse_double(alt_token, fsnav->imu->cfg,fsnav->imu->cfglength, (double *)alt_range,0);
		// raise coordinates validity flag
		fsnav->imu->sol.llh_valid = 1;
		// zero velocity at start
		for (i = 0; i < 3; i++)
			fsnav->imu->sol.v[i] = 0;
		fsnav->imu->sol.v_valid = 1;
		// reset previous time
		t0 = -1;

	}

	else if (fsnav->mode < 0) {	// termination
		// do nothing
	}

	else						// main cycle
	{
		// check for crucial data initialized
		if (   !fsnav->imu->sol.  v_valid 
			|| !fsnav->imu->sol.llh_valid 
			|| !fsnav->imu->sol.  L_valid 
			|| !fsnav->imu->f_valid 
			|| !fsnav->imu->g_valid)
			return;
		// time variables
		if (t0 < 0) { // first touch
			t0 = fsnav->imu->t;
			return;
		}
		dt = fsnav->imu->t - t0;
		t0 = fsnav->imu->t;
		// ellipsoid geometry
		sphi = sin(fsnav->imu->sol.llh[1]);
		cphi = cos(fsnav->imu->sol.llh[1]);
		e2s2 = fsnav->imu_const.e2*sphi*sphi;
		e4s4 = e2s2*e2s2;					
		Re_h = fsnav->imu_const.a*(1 + e2s2/2 + 3*e4s4/8);	                                        // Taylor expansion within 0.5 m, not altitude-adjusted
		Rn_h = Re_h*(1 - fsnav->imu_const.e2)*(1 + e2s2 + e4s4 + e2s2*e4s4) + fsnav->imu->sol.llh[2]; // Taylor expansion within 0.5 m
		Re_h += fsnav->imu->sol.llh[2];						                                        // adjust for altitude
		// drop validity flags
		fsnav->imu->W_valid       = 0;
		fsnav->imu->sol.llh_valid = 0;
		fsnav->imu->sol.  v_valid = 0;
		// angular rate of navigation frame relative to the Earth
		fsnav->imu->W[0] = -fsnav->imu->sol.v[1]/Rn_h;
		fsnav->imu->W[1] =  fsnav->imu->sol.v[0]/Re_h;	
		if (cphi < eps) { // check for Earth pole proximity
			fsnav->imu->W[2] = 0;    // freeze
			fsnav->imu->W_valid = 0; // drop validity
		}
		else {
			fsnav->imu->W[2] = fsnav->imu->sol.v[0]/Re_h*sphi/cphi;
			fsnav->imu->W_valid = 1;
		}
		// velocity
			// Coriolis acceleration
		dvrel[0] = fsnav->imu->W[0];
		dvrel[1] = fsnav->imu->W[1] + 2*fsnav->imu_const.u*cphi;
		dvrel[2] = fsnav->imu->W[2] + 2*fsnav->imu_const.u*sphi;
		fsnav_linal_cross3x1(dvcor, fsnav->imu->sol.v, dvrel);
			// proper acceleration
		if (fsnav->imu->w_valid) { // if able to calculate attitude mid-point using gyroscopes
			for (i = 0; i < 3; i++)
				dvrel[i] = fsnav->imu->w[i]*dt/2; // midpoint rotation Euler vector
			fsnav_linal_eul2mat(C_2, dvrel); // midpoint attitude matrix factor
			for (i = 0; i < 3; i++) // multiply C_2*f, store in the first row of C_2
				for (j = 1, C_2[i] = C_2[i*3]*fsnav->imu->f[0]; j < 3; j++)
					C_2[i] += C_2[i*3+j]*fsnav->imu->f[j];
			fsnav_linal_mmul1T(dvrel, fsnav->imu->sol.L, C_2, 3, 3, 1); // dvrel = L^T(t+dt)*C_2(w*dt/2)*f
		}
		else // otherwise, go on with only the current attitude matrix
			fsnav_linal_mmul1T(dvrel, fsnav->imu->sol.L, fsnav->imu->f, 3, 3, 1);
			// velocity update
		for (i = 0; i < 3; i++)
			fsnav->imu->sol.v[i] += (dvcor[i] + dvrel[i] + fsnav->imu->g[i])*dt;
		fsnav->imu->sol.v_valid = 1;
		// coordinates
		if (cphi < eps) { // check for Earth pole proximity
			fsnav->imu->sol.llh[2] += fsnav->imu->sol.v[2]				*dt;
			fsnav->imu->sol.llh_valid = 0; // drop validity
		}
		else {
			fsnav->imu->sol.llh[0] += fsnav->imu->sol.v[0]/(Re_h*cphi)	*dt;
			fsnav->imu->sol.llh[1] += fsnav->imu->sol.v[1]/ Rn_h			*dt;
			fsnav->imu->sol.llh[2] += fsnav->imu->sol.v[2]				*dt;
			// flip latitude if crossed a pole
			if (fsnav->imu->sol.llh[1] < -fsnav->imu_const.pi/2) { // South pole
				fsnav->imu->sol.llh[1] = -fsnav->imu_const.pi - fsnav->imu->sol.llh[1];
				fsnav_ins_motion_flip_sol_over_pole(&(fsnav->imu->sol));			
			}
			if (fsnav->imu->sol.llh[1] > +fsnav->imu_const.pi/2) { // North pole
				fsnav->imu->sol.llh[1] = +fsnav->imu_const.pi - fsnav->imu->sol.llh[1];
				fsnav_ins_motion_flip_sol_over_pole(&(fsnav->imu->sol));			
			}
			// adjust longitude into range
			while (fsnav->imu->sol.llh[0] < -fsnav->imu_const.pi)
				fsnav->imu->sol.llh[0] += 2*fsnav->imu_const.pi;
			while (fsnav->imu->sol.llh[0] > +fsnav->imu_const.pi)
				fsnav->imu->sol.llh[0] -= 2*fsnav->imu_const.pi;
			fsnav->imu->sol.llh_valid = 1;
		}
	}

}